

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void fill_empty_maze(level *lev)

{
  char let;
  int iVar1;
  obj *poVar2;
  bool bVar3;
  int local_24;
  coord local_20;
  char local_1e;
  char local_1d;
  int trytrap;
  coord mm;
  xchar y;
  xchar x;
  int mapfact;
  int mapcount;
  int mapcountmax;
  level *lev_local;
  
  _mm = (x_maze_max + -2) * (y_maze_max + -2);
  iVar1 = _mm / 2;
  for (local_1d = '\x02'; local_1d < x_maze_max; local_1d = local_1d + '\x01') {
    for (local_1e = '\0'; local_1e < y_maze_max; local_1e = local_1e + '\x01') {
      if (SpLev_Map[local_1d][local_1e] == '\0') {
        _mm = _mm + -1;
      }
    }
  }
  if (iVar1 / 10 < _mm) {
    trytrap = (int)(((long)_mm * 100) / (long)iVar1);
    iVar1 = rnd((trytrap * 0x14) / 100);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,1);
      iVar1 = rn2(2);
      let = '\0';
      if (iVar1 != 0) {
        let = '\r';
      }
      mkobj_at(let,lev,(int)local_20.x,(int)local_20.y,'\x01');
    }
    iVar1 = rnd((trytrap * 0xc) / 100);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,1);
      mksobj_at(0x214,lev,(int)local_20.x,(int)local_20.y,'\x01','\0');
    }
    iVar1 = rn2(2);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,1);
      makemon(mons + 0xb6,lev,(int)local_20.x,(int)local_20.y,0);
    }
    iVar1 = rnd((trytrap * 0xc) / 100);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,3);
      makemon((permonst *)0x0,lev,(int)local_20.x,(int)local_20.y,0);
    }
    iVar1 = rn2((trytrap * 0xf) / 100);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,1);
      mkgold(0,lev,(int)local_20.x,(int)local_20.y);
    }
    iVar1 = rn2((trytrap * 0xf) / 100);
    for (local_1d = (char)iVar1; local_1d != '\0'; local_1d = local_1d + -1) {
      maze1xy(lev,&local_20,1);
      local_24 = rndtrap(lev);
      poVar2 = sobj_at(0x214,lev,(int)local_20.x,(int)local_20.y);
      if (poVar2 != (obj *)0x0) {
        while( true ) {
          bVar3 = true;
          if (((local_24 != 0xb) && (bVar3 = true, local_24 != 0xc)) &&
             (bVar3 = true, local_24 != 0xe)) {
            bVar3 = local_24 == 0xd;
          }
          if (!bVar3) break;
          local_24 = rndtrap(lev);
        }
      }
      maketrap(lev,(int)local_20.x,(int)local_20.y,local_24);
    }
  }
  return;
}

Assistant:

static void fill_empty_maze(struct level *lev)
{
	int mapcountmax, mapcount, mapfact;
	xchar x, y;
	coord mm;

	mapcountmax = mapcount = (x_maze_max - 2) * (y_maze_max - 2);
	mapcountmax = mapcountmax / 2;

	for (x = 2; x < x_maze_max; x++) {
	    for (y = 0; y < y_maze_max; y++)
		if (!SpLev_Map[x][y]) mapcount--;
	}

	if (mapcount > (int)(mapcountmax / 10)) {
	    mapfact = (int)((mapcount * 100L) / mapcountmax);
	    for (x = rnd((int)(20 * mapfact) / 100); x; x--) {
		maze1xy(lev, &mm, DRY);
		mkobj_at(rn2(2) ? GEM_CLASS : RANDOM_CLASS,
			lev, mm.x, mm.y, TRUE);
	    }
	    for (x = rnd((int)(12 * mapfact) / 100); x; x--) {
		maze1xy(lev, &mm, DRY);
		mksobj_at(BOULDER, lev, mm.x, mm.y, TRUE, FALSE);
	    }
	    for (x = rn2(2); x; x--) {
		maze1xy(lev, &mm, DRY);
		makemon(&mons[PM_MINOTAUR], lev, mm.x, mm.y, NO_MM_FLAGS);
	    }
	    for (x = rnd((int)(12 * mapfact) / 100); x; x--) {
		maze1xy(lev, &mm, WET|DRY);
		makemon(NULL, lev, mm.x, mm.y, NO_MM_FLAGS);
	    }
	    for (x = rn2((int)(15 * mapfact) / 100); x; x--) {
		maze1xy(lev, &mm, DRY);
		mkgold(0L, lev, mm.x, mm.y);
	    }
	    for (x = rn2((int)(15 * mapfact) / 100); x; x--) {
		int trytrap;

		maze1xy(lev, &mm, DRY);
		trytrap = rndtrap(lev);
		if (sobj_at(BOULDER, lev, mm.x, mm.y)) {
		    while (trytrap == PIT || trytrap == SPIKED_PIT ||
			   trytrap == TRAPDOOR || trytrap == HOLE) {
			trytrap = rndtrap(lev);
		    }
		}
		maketrap(lev, mm.x, mm.y, trytrap);
	    }
	}
}